

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O3

void __thiscall wasm::Outlining::outline(Outlining *this,Module *module,Sequences *seqByFunc)

{
  pointer pOVar1;
  pointer pOVar2;
  long lVar3;
  Name name;
  Name name_00;
  pointer pOVar4;
  pointer wasm;
  mapped_type *pmVar5;
  ulong uVar6;
  Function *pFVar7;
  undefined1 auVar8 [8];
  _Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
  in_stack_fffffffffffffcf8;
  pointer local_258;
  pointer local_248;
  _Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_230;
  pointer local_1d8;
  pointer pOStack_1d0;
  pointer local_1c8;
  vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_> local_170;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_158 [2];
  vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_> local_d0;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b8;
  pointer local_70;
  undefined1 local_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> keys;
  undefined1 auStack_48 [8];
  Name func;
  
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68,
             (seqByFunc->_M_h)._M_element_count,(allocator_type *)&stack0xfffffffffffffcf8);
  std::
  transform<std::__detail::_Node_iterator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,false,true>,__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(auto:1)_1_>
            ((seqByFunc->_M_h)._M_before_begin._M_nxt,0,local_68);
  local_70 = keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_68 !=
      (undefined1  [8])
      keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar8 = local_68;
    keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)module;
    do {
      auStack_48 = (undefined1  [8])(((pointer)auVar8)->super_IString).str._M_len;
      func.super_IString.str._M_len = (size_t)(((pointer)auVar8)->super_IString).str._M_str;
      pmVar5 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)seqByFunc,(key_type *)auStack_48);
      pOVar1 = (pmVar5->
               super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pmVar5 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)seqByFunc,(key_type *)auStack_48);
      pOVar2 = (pmVar5->
               super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pOVar1 != pOVar2) {
        uVar6 = (long)pOVar2 - (long)pOVar1 >> 5;
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wasm::OutliningSequence*,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(wasm::OutliningSequence,wasm::OutliningSequence)_1_>>
                  (pOVar1,pOVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<wasm::OutliningSequence*,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(wasm::OutliningSequence,wasm::OutliningSequence)_1_>>
                  (pOVar1,pOVar2);
      }
      wasm = keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      name.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)auStack_48;
      pFVar7 = Module::getFunction((Module *)
                                   keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,name);
      ReconstructStringifyWalker::ReconstructStringifyWalker
                ((ReconstructStringifyWalker *)&stack0xfffffffffffffcf8,(Module *)wasm,pFVar7);
      pmVar5 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)seqByFunc,(key_type *)auStack_48);
      pOVar4 = local_1d8;
      pOVar2 = (pmVar5->
               super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pOStack_1d0 = (pmVar5->
                    super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      pOVar1 = (pmVar5->
               super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar5->super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar5->super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pmVar5->super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1d8 != (pointer)0x0) {
        uVar6 = (long)local_1c8 - (long)local_1d8;
        local_1d8 = pOVar2;
        local_1c8 = pOVar1;
        operator_delete(pOVar4,uVar6);
        pOVar2 = local_1d8;
        pOVar1 = local_1c8;
      }
      local_1c8 = pOVar1;
      local_1d8 = pOVar2;
      name_00.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)auStack_48;
      pFVar7 = Module::getFunction((Module *)
                                   keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,name_00);
      ReconstructStringifyWalker::startExistingFunction
                ((ReconstructStringifyWalker *)&stack0xfffffffffffffcf8,pFVar7);
      Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              *)&stack0xfffffffffffffcf8,&pFVar7->body);
      ReconstructStringifyWalker::addUniqueSymbol
                ((ReconstructStringifyWalker *)&stack0xfffffffffffffcf8,
                 (SeparatorReason)in_stack_fffffffffffffcf8);
      while (local_230._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_230._M_impl.super__Deque_impl_data._M_start._M_cur) {
        StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow
                  ((StringifyWalker<wasm::ReconstructStringifyWalker> *)&stack0xfffffffffffffcf8);
      }
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_b8);
      std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::~vector
                (&local_d0);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_158);
      std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::~vector
                (&local_170);
      if (local_1d8 != (pointer)0x0) {
        operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
      }
      std::_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Deque_base
                (&local_230);
      if (local_258 != (pointer)0x0) {
        operator_delete(local_258,(long)local_248 - (long)local_258);
      }
      auVar8 = (undefined1  [8])((long)auVar8 + 0x10);
    } while (auVar8 != (undefined1  [8])local_70);
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    (long)keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_68);
  }
  return;
}

Assistant:

void outline(Module* module,
               Sequences seqByFunc
#if OUTLINING_DEBUG
               ,
               const HashStringifyWalker& stringify
#endif
  ) {
    // TODO: Make this a function-parallel sub-pass.
    std::vector<Name> keys(seqByFunc.size());
    std::transform(seqByFunc.begin(),
                   seqByFunc.end(),
                   keys.begin(),
                   [](auto pair) { return pair.first; });
    for (auto func : keys) {
      // During function reconstruction, a walker iterates thru each instruction
      // of a function, incrementing a counter to find matching sequences. As a
      // result, the sequences of a function must be sorted by
      // smallest start index, otherwise reconstruction will miss outlining a
      // repeat sequence.
      std::sort(seqByFunc[func].begin(),
                seqByFunc[func].end(),
                [](OutliningSequence a, OutliningSequence b) {
                  return a.startIdx < b.startIdx;
                });
      ReconstructStringifyWalker reconstruct(module, module->getFunction(func));
      reconstruct.sequences = std::move(seqByFunc[func]);
      ODBG(printReconstruct(module,
                            stringify.hashString,
                            stringify.exprs,
                            func,
                            reconstruct.sequences));
      reconstruct.doWalkFunction(module->getFunction(func));
    }
  }